

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastV8R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  ParseContext *pPVar7;
  ParseContext *extraout_RDX;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  uint uVar10;
  uint *puVar11;
  RepeatedField<bool> *this;
  ulong unaff_R14;
  undefined7 uVar8;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  this = (RepeatedField<bool> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  cVar1 = *ptr;
  pPVar7 = ctx;
  pcVar6 = ptr;
  do {
    aVar9.data = (long)ptr + 2;
    bVar2 = *(byte *)((long)ptr + 1);
    uVar8 = (undefined7)((ulong)pPVar7 >> 8);
    pPVar7 = (ParseContext *)CONCAT71(uVar8,bVar2);
    if (bVar2 < 2) {
      unaff_R14 = (ulong)pPVar7 & 0xffffffff;
      ptr = (char *)aVar9.data;
    }
    else {
      bVar3 = 1;
      if ((char)bVar2 < '\0') {
        pPVar7 = (ParseContext *)(CONCAT71(uVar8,bVar2) & 0xffffffffffffff7f);
        bVar4 = *(byte *)((long)ptr + 2);
        aVar9._1_7_ = (undefined7)((ulong)aVar9 >> 8);
        bVar3 = bVar2 & 0x7f | bVar4;
        if ((char)bVar4 < '\0') {
          bVar4 = bVar2 & 0x7f | bVar4 & 0x7f;
          bVar2 = *(byte *)((long)ptr + 3);
          bVar3 = bVar4 | bVar2;
          if ((char)bVar2 < '\0') {
            bVar4 = bVar4 | bVar2 & 0x7f;
            bVar2 = *(byte *)((long)ptr + 4);
            bVar3 = bVar4 | bVar2;
            if ((char)bVar2 < '\0') {
              bVar4 = bVar4 | bVar2 & 0x7f;
              bVar2 = *(byte *)((long)ptr + 5);
              bVar3 = bVar4 | bVar2;
              if ((char)bVar2 < '\0') {
                bVar4 = bVar4 | bVar2 & 0x7f;
                bVar2 = *(byte *)((long)ptr + 6);
                bVar3 = bVar4 | bVar2;
                if ((char)bVar2 < '\0') {
                  bVar4 = bVar4 | bVar2 & 0x7f;
                  bVar2 = *(byte *)((long)ptr + 7);
                  bVar3 = bVar4 | bVar2;
                  if ((char)bVar2 < '\0') {
                    bVar4 = bVar4 | bVar2 & 0x7f;
                    bVar2 = *(byte *)((long)ptr + 8);
                    bVar3 = bVar4 | bVar2;
                    if ((char)bVar2 < '\0') {
                      bVar4 = bVar4 | bVar2 & 0x7f;
                      bVar2 = *(byte *)((long)ptr + 9);
                      bVar3 = bVar4 | bVar2;
                      if ((char)bVar2 < '\0') {
                        bVar3 = *(byte *)((long)ptr + 10);
                        aVar9.data._0_1_ = bVar3;
                        if ((char)bVar3 < '\0') {
                          ptr = (char *)0;
                          goto LAB_00217539;
                        }
                        aVar9.data = (long)ptr + 0xb;
                        bVar3 = bVar4 | bVar2 & 0x7f | bVar3 & 0x81;
                      }
                      else {
                        aVar9.data = (long)ptr + 10;
                      }
                    }
                    else {
                      aVar9.data = (long)ptr + 9;
                    }
                  }
                  else {
                    aVar9.data = (long)ptr + 8;
                  }
                }
                else {
                  aVar9.data = (long)ptr + 7;
                }
              }
              else {
                aVar9.data = (long)ptr + 6;
              }
            }
            else {
              aVar9.data = (long)ptr + 5;
            }
          }
          else {
            aVar9.data = (long)ptr + 4;
          }
        }
        else {
          aVar9.data = (long)ptr + 3;
        }
      }
      unaff_R14 = (ulong)(bVar3 != 0);
      ptr = (char *)aVar9;
    }
LAB_00217539:
    if ((ushort *)ptr == (ushort *)0x0) {
      pcVar6 = Error(msg,pcVar6,pPVar7,(TcFieldData)aVar9,table,hasbits);
      return pcVar6;
    }
    uVar10 = (uint)unaff_R14 & 1;
    pcVar6 = (char *)(ulong)uVar10;
    RepeatedField<bool>::Add(this,SUB41(uVar10,0));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar11 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar11 & 3) != 0) {
          AlignFail();
        }
        *puVar11 = *puVar11 | (uint)hasbits;
      }
      return (char *)(uint64_t)ptr;
    }
    pPVar7 = extraout_RDX;
    if (*ptr != cVar1) {
      uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
      if ((uVar10 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar5 = (ulong)(uVar10 & 0xfffffff8);
      pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                 (msg,ptr,ctx,
                                  (ulong)*(ushort *)ptr ^
                                  *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),table,hasbits);
      return pcVar6;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}